

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O2

void __thiscall
google::protobuf::TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection2
          (ReflectionTester *this,Message *message)

{
  bool bVar1;
  int32_t iVar2;
  FieldDescriptor *pFVar3;
  string *psVar4;
  Message *pMVar5;
  Reflection *this_00;
  char *pcVar6;
  char *in_R9;
  Metadata MVar7;
  allocator<char> local_99;
  AssertionResult gtest_ar_37;
  AssertionResult gtest_ar_41;
  AssertionResult gtest_ar;
  AssertHelper local_48;
  string scratch;
  
  MVar7 = Message::GetMetadata(message);
  this_00 = MVar7.reflection;
  scratch._M_dataplus._M_p = (pointer)&scratch.field_2;
  scratch._M_string_length = 0;
  scratch.field_2._M_local_buf[0] = '\0';
  gtest_ar_37._0_4_ = 2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_41,"repeated_int32",&local_99);
  pFVar3 = F(this,(string *)&gtest_ar_41);
  local_48.data_._0_4_ = (float)Reflection::FieldSize(this_00,message,pFVar3);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"2","reflection->FieldSize(message, F(\"repeated_int32\"))",
             (int *)&gtest_ar_37,(int *)&local_48);
  std::__cxx11::string::~string((string *)&gtest_ar_41);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_41);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_37,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
               ,0x24c,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41)
    ;
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    gtest_ar_37._0_4_ = 2;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_ar_41,"repeated_int64",&local_99);
    pFVar3 = F(this,(string *)&gtest_ar_41);
    local_48.data_._0_4_ = (float)Reflection::FieldSize(this_00,message,pFVar3);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"2","reflection->FieldSize(message, F(\"repeated_int64\"))",
               (int *)&gtest_ar_37,(int *)&local_48);
    std::__cxx11::string::~string((string *)&gtest_ar_41);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_41);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar6 = anon_var_dwarf_651463 + 5;
      }
      else {
        pcVar6 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                 ,0x24d,pcVar6);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      gtest_ar_37._0_4_ = 2;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&gtest_ar_41,"repeated_uint32",&local_99);
      pFVar3 = F(this,(string *)&gtest_ar_41);
      local_48.data_._0_4_ = (float)Reflection::FieldSize(this_00,message,pFVar3);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"2","reflection->FieldSize(message, F(\"repeated_uint32\"))",
                 (int *)&gtest_ar_37,(int *)&local_48);
      std::__cxx11::string::~string((string *)&gtest_ar_41);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_41);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar6 = anon_var_dwarf_651463 + 5;
        }
        else {
          pcVar6 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                   ,0x24e,pcVar6);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar.message_);
        gtest_ar_37._0_4_ = 2;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&gtest_ar_41,"repeated_uint64",&local_99);
        pFVar3 = F(this,(string *)&gtest_ar_41);
        local_48.data_._0_4_ = (float)Reflection::FieldSize(this_00,message,pFVar3);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"2",
                   "reflection->FieldSize(message, F(\"repeated_uint64\"))",(int *)&gtest_ar_37,
                   (int *)&local_48);
        std::__cxx11::string::~string((string *)&gtest_ar_41);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_41);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar6 = anon_var_dwarf_651463 + 5;
          }
          else {
            pcVar6 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                     ,0x24f,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41);
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          gtest_ar_37._0_4_ = 2;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&gtest_ar_41,"repeated_sint32",&local_99);
          pFVar3 = F(this,(string *)&gtest_ar_41);
          local_48.data_._0_4_ = (float)Reflection::FieldSize(this_00,message,pFVar3);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"2",
                     "reflection->FieldSize(message, F(\"repeated_sint32\"))",(int *)&gtest_ar_37,
                     (int *)&local_48);
          std::__cxx11::string::~string((string *)&gtest_ar_41);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_41);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar6 = anon_var_dwarf_651463 + 5;
            }
            else {
              pcVar6 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                       ,0x250,pcVar6);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41);
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar.message_);
            gtest_ar_37._0_4_ = 2;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&gtest_ar_41,"repeated_sint64",&local_99);
            pFVar3 = F(this,(string *)&gtest_ar_41);
            local_48.data_._0_4_ = (float)Reflection::FieldSize(this_00,message,pFVar3);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"2",
                       "reflection->FieldSize(message, F(\"repeated_sint64\"))",(int *)&gtest_ar_37,
                       (int *)&local_48);
            std::__cxx11::string::~string((string *)&gtest_ar_41);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_41);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar6 = anon_var_dwarf_651463 + 5;
              }
              else {
                pcVar6 = *(char **)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                         ,0x251,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar.message_);
              gtest_ar_37._0_4_ = 2;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&gtest_ar_41,"repeated_fixed32",&local_99);
              pFVar3 = F(this,(string *)&gtest_ar_41);
              local_48.data_._0_4_ = (float)Reflection::FieldSize(this_00,message,pFVar3);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&gtest_ar,"2",
                         "reflection->FieldSize(message, F(\"repeated_fixed32\"))",
                         (int *)&gtest_ar_37,(int *)&local_48);
              std::__cxx11::string::~string((string *)&gtest_ar_41);
              if (gtest_ar.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar_41);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar6 = anon_var_dwarf_651463 + 5;
                }
                else {
                  pcVar6 = *(char **)gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                           ,0x252,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41);
              }
              else {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar.message_);
                gtest_ar_37._0_4_ = 2;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&gtest_ar_41,"repeated_fixed64",&local_99);
                pFVar3 = F(this,(string *)&gtest_ar_41);
                local_48.data_._0_4_ = (float)Reflection::FieldSize(this_00,message,pFVar3);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar,"2",
                           "reflection->FieldSize(message, F(\"repeated_fixed64\"))",
                           (int *)&gtest_ar_37,(int *)&local_48);
                std::__cxx11::string::~string((string *)&gtest_ar_41);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar_41);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar6 = anon_var_dwarf_651463 + 5;
                  }
                  else {
                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                             ,0x253,pcVar6);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41);
                }
                else {
                  std::
                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~unique_ptr(&gtest_ar.message_);
                  gtest_ar_37._0_4_ = 2;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&gtest_ar_41,"repeated_sfixed32",&local_99);
                  pFVar3 = F(this,(string *)&gtest_ar_41);
                  local_48.data_._0_4_ = (float)Reflection::FieldSize(this_00,message,pFVar3);
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&gtest_ar,"2",
                             "reflection->FieldSize(message, F(\"repeated_sfixed32\"))",
                             (int *)&gtest_ar_37,(int *)&local_48);
                  std::__cxx11::string::~string((string *)&gtest_ar_41);
                  if (gtest_ar.success_ == false) {
                    testing::Message::Message((Message *)&gtest_ar_41);
                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl ==
                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )0x0) {
                      pcVar6 = anon_var_dwarf_651463 + 5;
                    }
                    else {
                      pcVar6 = *(char **)gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                               ,0x254,pcVar6);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41);
                  }
                  else {
                    std::
                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~unique_ptr(&gtest_ar.message_);
                    gtest_ar_37._0_4_ = 2;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&gtest_ar_41,"repeated_sfixed64",&local_99);
                    pFVar3 = F(this,(string *)&gtest_ar_41);
                    local_48.data_._0_4_ = (float)Reflection::FieldSize(this_00,message,pFVar3);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&gtest_ar,"2",
                               "reflection->FieldSize(message, F(\"repeated_sfixed64\"))",
                               (int *)&gtest_ar_37,(int *)&local_48);
                    std::__cxx11::string::~string((string *)&gtest_ar_41);
                    if (gtest_ar.success_ == false) {
                      testing::Message::Message((Message *)&gtest_ar_41);
                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl ==
                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )0x0) {
                        pcVar6 = anon_var_dwarf_651463 + 5;
                      }
                      else {
                        pcVar6 = *(char **)gtest_ar.message_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                 ,0x255,pcVar6);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41);
                    }
                    else {
                      std::
                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~unique_ptr(&gtest_ar.message_);
                      gtest_ar_37._0_4_ = 2;
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&gtest_ar_41,"repeated_float",&local_99);
                      pFVar3 = F(this,(string *)&gtest_ar_41);
                      local_48.data_._0_4_ = (float)Reflection::FieldSize(this_00,message,pFVar3);
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&gtest_ar,"2",
                                 "reflection->FieldSize(message, F(\"repeated_float\"))",
                                 (int *)&gtest_ar_37,(int *)&local_48);
                      std::__cxx11::string::~string((string *)&gtest_ar_41);
                      if (gtest_ar.success_ == false) {
                        testing::Message::Message((Message *)&gtest_ar_41);
                        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )gtest_ar.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl ==
                            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )0x0) {
                          pcVar6 = anon_var_dwarf_651463 + 5;
                        }
                        else {
                          pcVar6 = *(char **)gtest_ar.message_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                   ,0x256,pcVar6);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41);
                      }
                      else {
                        std::
                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~unique_ptr(&gtest_ar.message_);
                        gtest_ar_37._0_4_ = 2;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&gtest_ar_41,"repeated_double",&local_99);
                        pFVar3 = F(this,(string *)&gtest_ar_41);
                        local_48.data_._0_4_ = (float)Reflection::FieldSize(this_00,message,pFVar3);
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)&gtest_ar,"2",
                                   "reflection->FieldSize(message, F(\"repeated_double\"))",
                                   (int *)&gtest_ar_37,(int *)&local_48);
                        std::__cxx11::string::~string((string *)&gtest_ar_41);
                        if (gtest_ar.success_ == false) {
                          testing::Message::Message((Message *)&gtest_ar_41);
                          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl ==
                              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )0x0) {
                            pcVar6 = anon_var_dwarf_651463 + 5;
                          }
                          else {
                            pcVar6 = *(char **)gtest_ar.message_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                     ,599,pcVar6);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41);
                        }
                        else {
                          std::
                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::~unique_ptr(&gtest_ar.message_);
                          gtest_ar_37._0_4_ = 2;
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&gtest_ar_41,"repeated_bool",&local_99);
                          pFVar3 = F(this,(string *)&gtest_ar_41);
                          local_48.data_._0_4_ =
                               (float)Reflection::FieldSize(this_00,message,pFVar3);
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&gtest_ar,"2",
                                     "reflection->FieldSize(message, F(\"repeated_bool\"))",
                                     (int *)&gtest_ar_37,(int *)&local_48);
                          std::__cxx11::string::~string((string *)&gtest_ar_41);
                          if (gtest_ar.success_ == false) {
                            testing::Message::Message((Message *)&gtest_ar_41);
                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )gtest_ar.message_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl ==
                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )0x0) {
                              pcVar6 = anon_var_dwarf_651463 + 5;
                            }
                            else {
                              pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 .
                                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                 ._M_head_impl;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                       ,600,pcVar6);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41);
                          }
                          else {
                            std::
                            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::~unique_ptr(&gtest_ar.message_);
                            gtest_ar_37._0_4_ = 2;
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&gtest_ar_41,"repeated_string",&local_99);
                            pFVar3 = F(this,(string *)&gtest_ar_41);
                            local_48.data_._0_4_ =
                                 (float)Reflection::FieldSize(this_00,message,pFVar3);
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)&gtest_ar,"2",
                                       "reflection->FieldSize(message, F(\"repeated_string\"))",
                                       (int *)&gtest_ar_37,(int *)&local_48);
                            std::__cxx11::string::~string((string *)&gtest_ar_41);
                            if (gtest_ar.success_ == false) {
                              testing::Message::Message((Message *)&gtest_ar_41);
                              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )gtest_ar.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl ==
                                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )0x0) {
                                pcVar6 = anon_var_dwarf_651463 + 5;
                              }
                              else {
                                pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                         ,0x259,pcVar6);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41);
                            }
                            else {
                              std::
                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::~unique_ptr(&gtest_ar.message_);
                              gtest_ar_37._0_4_ = 2;
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&gtest_ar_41,"repeated_bytes",&local_99);
                              pFVar3 = F(this,(string *)&gtest_ar_41);
                              local_48.data_._0_4_ =
                                   (float)Reflection::FieldSize(this_00,message,pFVar3);
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)&gtest_ar,"2",
                                         "reflection->FieldSize(message, F(\"repeated_bytes\"))",
                                         (int *)&gtest_ar_37,(int *)&local_48);
                              std::__cxx11::string::~string((string *)&gtest_ar_41);
                              if (gtest_ar.success_ == false) {
                                testing::Message::Message((Message *)&gtest_ar_41);
                                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )gtest_ar.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl ==
                                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )0x0) {
                                  pcVar6 = anon_var_dwarf_651463 + 5;
                                }
                                else {
                                  pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                           ,0x25a,pcVar6);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41);
                              }
                              else {
                                std::
                                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::~unique_ptr(&gtest_ar.message_);
                                gtest_ar_37._0_4_ = 2;
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&gtest_ar_41,"repeatedgroup",&local_99);
                                pFVar3 = F(this,(string *)&gtest_ar_41);
                                local_48.data_._0_4_ =
                                     (float)Reflection::FieldSize(this_00,message,pFVar3);
                                testing::internal::CmpHelperEQ<int,int>
                                          ((internal *)&gtest_ar,"2",
                                           "reflection->FieldSize(message, F(\"repeatedgroup\"))",
                                           (int *)&gtest_ar_37,(int *)&local_48);
                                std::__cxx11::string::~string((string *)&gtest_ar_41);
                                if (gtest_ar.success_ == false) {
                                  testing::Message::Message((Message *)&gtest_ar_41);
                                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )gtest_ar.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl ==
                                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )0x0) {
                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                  }
                                  else {
                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                             ,0x25c,pcVar6);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41);
                                }
                                else {
                                  std::
                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::~unique_ptr(&gtest_ar.message_);
                                  gtest_ar_37._0_4_ = 2;
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&gtest_ar_41,"repeated_nested_message",
                                             &local_99);
                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                  local_48.data_._0_4_ =
                                       (float)Reflection::FieldSize(this_00,message,pFVar3);
                                  testing::internal::CmpHelperEQ<int,int>
                                            ((internal *)&gtest_ar,"2",
                                             "reflection->FieldSize(message, F(\"repeated_nested_message\"))"
                                             ,(int *)&gtest_ar_37,(int *)&local_48);
                                  std::__cxx11::string::~string((string *)&gtest_ar_41);
                                  if (gtest_ar.success_ == false) {
                                    testing::Message::Message((Message *)&gtest_ar_41);
                                    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )gtest_ar.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl ==
                                        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )0x0) {
                                      pcVar6 = anon_var_dwarf_651463 + 5;
                                    }
                                    else {
                                      pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                               ,0x25d,pcVar6);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_37,(Message *)&gtest_ar_41)
                                    ;
                                  }
                                  else {
                                    std::
                                    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::~unique_ptr(&gtest_ar.message_);
                                    gtest_ar_37._0_4_ = 2;
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&gtest_ar_41,"repeated_foreign_message",
                                               &local_99);
                                    pFVar3 = F(this,(string *)&gtest_ar_41);
                                    local_48.data_._0_4_ =
                                         (float)Reflection::FieldSize(this_00,message,pFVar3);
                                    testing::internal::CmpHelperEQ<int,int>
                                              ((internal *)&gtest_ar,"2",
                                               "reflection->FieldSize(message, F(\"repeated_foreign_message\"))"
                                               ,(int *)&gtest_ar_37,(int *)&local_48);
                                    std::__cxx11::string::~string((string *)&gtest_ar_41);
                                    if (gtest_ar.success_ == false) {
                                      testing::Message::Message((Message *)&gtest_ar_41);
                                      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )gtest_ar.message_._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl ==
                                          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )0x0) {
                                        pcVar6 = anon_var_dwarf_651463 + 5;
                                      }
                                      else {
                                        pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                 ,0x25e,pcVar6);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_37,
                                                 (Message *)&gtest_ar_41);
                                    }
                                    else {
                                      std::
                                      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::~unique_ptr(&gtest_ar.message_);
                                      gtest_ar_37._0_4_ = 2;
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&gtest_ar_41,"repeated_import_message",
                                                 &local_99);
                                      pFVar3 = F(this,(string *)&gtest_ar_41);
                                      local_48.data_._0_4_ =
                                           (float)Reflection::FieldSize(this_00,message,pFVar3);
                                      testing::internal::CmpHelperEQ<int,int>
                                                ((internal *)&gtest_ar,"2",
                                                 "reflection->FieldSize(message, F(\"repeated_import_message\"))"
                                                 ,(int *)&gtest_ar_37,(int *)&local_48);
                                      std::__cxx11::string::~string((string *)&gtest_ar_41);
                                      if (gtest_ar.success_ == false) {
                                        testing::Message::Message((Message *)&gtest_ar_41);
                                        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )gtest_ar.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl ==
                                            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )0x0) {
                                          pcVar6 = anon_var_dwarf_651463 + 5;
                                        }
                                        else {
                                          pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x25f,pcVar6);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_37,
                                                   (Message *)&gtest_ar_41);
                                      }
                                      else {
                                        std::
                                        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ::~unique_ptr(&gtest_ar.message_);
                                        gtest_ar_37._0_4_ = 2;
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&gtest_ar_41,"repeated_lazy_message",
                                                   &local_99);
                                        pFVar3 = F(this,(string *)&gtest_ar_41);
                                        local_48.data_._0_4_ =
                                             (float)Reflection::FieldSize(this_00,message,pFVar3);
                                        testing::internal::CmpHelperEQ<int,int>
                                                  ((internal *)&gtest_ar,"2",
                                                                                                      
                                                  "reflection->FieldSize(message, F(\"repeated_lazy_message\"))"
                                                  ,(int *)&gtest_ar_37,(int *)&local_48);
                                        std::__cxx11::string::~string((string *)&gtest_ar_41);
                                        if (gtest_ar.success_ == false) {
                                          testing::Message::Message((Message *)&gtest_ar_41);
                                          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )gtest_ar.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                ._M_head_impl ==
                                              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               )0x0) {
                                            pcVar6 = anon_var_dwarf_651463 + 5;
                                          }
                                          else {
                                            pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x260,pcVar6);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_37,
                                                     (Message *)&gtest_ar_41);
                                        }
                                        else {
                                          std::
                                          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::~unique_ptr(&gtest_ar.message_);
                                          gtest_ar_37._0_4_ = 2;
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&gtest_ar_41,"repeated_nested_enum",
                                                     &local_99);
                                          pFVar3 = F(this,(string *)&gtest_ar_41);
                                          local_48.data_._0_4_ =
                                               (float)Reflection::FieldSize(this_00,message,pFVar3);
                                          testing::internal::CmpHelperEQ<int,int>
                                                    ((internal *)&gtest_ar,"2",
                                                                                                          
                                                  "reflection->FieldSize(message, F(\"repeated_nested_enum\"))"
                                                  ,(int *)&gtest_ar_37,(int *)&local_48);
                                          std::__cxx11::string::~string((string *)&gtest_ar_41);
                                          if (gtest_ar.success_ == false) {
                                            testing::Message::Message((Message *)&gtest_ar_41);
                                            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                 )0x0) {
                                              pcVar6 = anon_var_dwarf_651463 + 5;
                                            }
                                            else {
                                              pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                  
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x261,pcVar6);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&gtest_ar_37,
                                                       (Message *)&gtest_ar_41);
                                          }
                                          else {
                                            std::
                                            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::~unique_ptr(&gtest_ar.message_);
                                            gtest_ar_37._0_4_ = 2;
                                            std::__cxx11::string::string<std::allocator<char>>
                                                      ((string *)&gtest_ar_41,
                                                       "repeated_foreign_enum",&local_99);
                                            pFVar3 = F(this,(string *)&gtest_ar_41);
                                            local_48.data_._0_4_ =
                                                 (float)Reflection::FieldSize
                                                                  (this_00,message,pFVar3);
                                            testing::internal::CmpHelperEQ<int,int>
                                                      ((internal *)&gtest_ar,"2",
                                                                                                              
                                                  "reflection->FieldSize(message, F(\"repeated_foreign_enum\"))"
                                                  ,(int *)&gtest_ar_37,(int *)&local_48);
                                            std::__cxx11::string::~string((string *)&gtest_ar_41);
                                            if (gtest_ar.success_ == false) {
                                              testing::Message::Message((Message *)&gtest_ar_41);
                                              if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                pcVar6 = anon_var_dwarf_651463 + 5;
                                              }
                                              else {
                                                pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                              }
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&gtest_ar_37,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x262,pcVar6);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&gtest_ar_37,
                                                         (Message *)&gtest_ar_41);
                                            }
                                            else {
                                              std::
                                              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ::~unique_ptr(&gtest_ar.message_);
                                              gtest_ar_37._0_4_ = 2;
                                              std::__cxx11::string::string<std::allocator<char>>
                                                        ((string *)&gtest_ar_41,
                                                         "repeated_import_enum",&local_99);
                                              pFVar3 = F(this,(string *)&gtest_ar_41);
                                              local_48.data_._0_4_ =
                                                   (float)Reflection::FieldSize
                                                                    (this_00,message,pFVar3);
                                              testing::internal::CmpHelperEQ<int,int>
                                                        ((internal *)&gtest_ar,"2",
                                                                                                                  
                                                  "reflection->FieldSize(message, F(\"repeated_import_enum\"))"
                                                  ,(int *)&gtest_ar_37,(int *)&local_48);
                                              std::__cxx11::string::~string((string *)&gtest_ar_41);
                                              if (gtest_ar.success_ == false) {
                                                testing::Message::Message((Message *)&gtest_ar_41);
                                                if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                  pcVar6 = anon_var_dwarf_651463 + 5;
                                                }
                                                else {
                                                  pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                          
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                }
                                                testing::internal::AssertHelper::AssertHelper
                                                          ((AssertHelper *)&gtest_ar_37,
                                                           kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x263,pcVar6);
                                                testing::internal::AssertHelper::operator=
                                                          ((AssertHelper *)&gtest_ar_37,
                                                           (Message *)&gtest_ar_41);
                                              }
                                              else {
                                                std::
                                                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ::~unique_ptr(&gtest_ar.message_);
                                                gtest_ar_37._0_4_ = 2;
                                                std::__cxx11::string::string<std::allocator<char>>
                                                          ((string *)&gtest_ar_41,
                                                           "repeated_string_piece",&local_99);
                                                pFVar3 = F(this,(string *)&gtest_ar_41);
                                                local_48.data_._0_4_ =
                                                     (float)Reflection::FieldSize
                                                                      (this_00,message,pFVar3);
                                                testing::internal::CmpHelperEQ<int,int>
                                                          ((internal *)&gtest_ar,"2",
                                                                                                                      
                                                  "reflection->FieldSize(message, F(\"repeated_string_piece\"))"
                                                  ,(int *)&gtest_ar_37,(int *)&local_48);
                                                std::__cxx11::string::~string
                                                          ((string *)&gtest_ar_41);
                                                if (gtest_ar.success_ == false) {
                                                  testing::Message::Message((Message *)&gtest_ar_41)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x265,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                }
                                                else {
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  gtest_ar_37._0_4_ = 2;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,"repeated_cord",
                                                             &local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  local_48.data_._0_4_ =
                                                       (float)Reflection::FieldSize
                                                                        (this_00,message,pFVar3);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar,"2",
                                                                                                                          
                                                  "reflection->FieldSize(message, F(\"repeated_cord\"))"
                                                  ,(int *)&gtest_ar_37,(int *)&local_48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ != false) {
                                                    std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  gtest_ar_37._0_4_ = 0xc9;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,"repeated_int32"
                                                             ,&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  local_48.data_._0_4_ =
                                                       (float)Reflection::GetRepeatedInt32
                                                                        (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar,"201",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_int32\"), 0)"
                                                  ,(int *)&gtest_ar_37,(int *)&local_48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x268,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  local_48.data_._0_4_ = 2.83062e-43;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,"repeated_int64"
                                                             ,&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedInt64
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)&gtest_ar,"202",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_int64\"), 0)"
                                                  ,(int *)&local_48,(long *)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x269,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  gtest_ar_37._0_4_ = 0xcb;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_uint32",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  local_48.data_._0_4_ =
                                                       (float)Reflection::GetRepeatedUInt32
                                                                        (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)&gtest_ar,"203",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt32(message, F(\"repeated_uint32\"), 0)"
                                                  ,(int *)&gtest_ar_37,(uint *)&local_48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x26b,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  local_48.data_._0_4_ = 2.85865e-43;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_uint64",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedUInt64
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)&gtest_ar,"204",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt64(message, F(\"repeated_uint64\"), 0)"
                                                  ,(int *)&local_48,(unsigned_long *)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x26d,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  gtest_ar_37._0_4_ = 0xcd;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_sint32",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  local_48.data_._0_4_ =
                                                       (float)Reflection::GetRepeatedInt32
                                                                        (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar,"205",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_sint32\"), 0)"
                                                  ,(int *)&gtest_ar_37,(int *)&local_48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x26f,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  local_48.data_._0_4_ = 2.88667e-43;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_sint64",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedInt64
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)&gtest_ar,"206",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_sint64\"), 0)"
                                                  ,(int *)&local_48,(long *)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x271,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  gtest_ar_37._0_4_ = 0xcf;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_fixed32",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  local_48.data_._0_4_ =
                                                       (float)Reflection::GetRepeatedUInt32
                                                                        (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)&gtest_ar,"207",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt32(message, F(\"repeated_fixed32\"), 0)"
                                                  ,(int *)&gtest_ar_37,(uint *)&local_48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x273,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  local_48.data_._0_4_ = 2.9147e-43;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_fixed64",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedUInt64
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)&gtest_ar,"208",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt64(message, F(\"repeated_fixed64\"), 0)"
                                                  ,(int *)&local_48,(unsigned_long *)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x275,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  gtest_ar_37._0_4_ = 0xd1;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_sfixed32",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  local_48.data_._0_4_ =
                                                       (float)Reflection::GetRepeatedInt32
                                                                        (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar,"209",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_sfixed32\"), 0)"
                                                  ,(int *)&gtest_ar_37,(int *)&local_48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x277,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  local_48.data_._0_4_ = 2.94273e-43;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_sfixed64",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedInt64
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)&gtest_ar,"210",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_sfixed64\"), 0)"
                                                  ,(int *)&local_48,(long *)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x279,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  gtest_ar_37._0_4_ = 0xd3;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,"repeated_float"
                                                             ,&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  local_48.data_._0_4_ =
                                                       Reflection::GetRepeatedFloat
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,float>
                                                            ((internal *)&gtest_ar,"211",
                                                                                                                          
                                                  "reflection->GetRepeatedFloat(message, F(\"repeated_float\"), 0)"
                                                  ,(int *)&gtest_ar_37,(float *)&local_48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x27a,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  local_48.data_._0_4_ = 2.97075e-43;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_double",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedDouble
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::CmpHelperEQ<int,double>
                                                            ((internal *)&gtest_ar,"212",
                                                                                                                          
                                                  "reflection->GetRepeatedDouble(message, F(\"repeated_double\"), 0)"
                                                  ,(int *)&local_48,(double *)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x27c,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,"repeated_bool",
                                                             (allocator<char> *)&gtest_ar_37);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  bVar1 = Reflection::GetRepeatedBool
                                                                    (this_00,message,pFVar3,0);
                                                  gtest_ar.success_ = bVar1;
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )(
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0;
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_37);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar_41,
                                                               (internal *)&gtest_ar,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "reflection->GetRepeatedBool(message, F(\"repeated_bool\"), 0)"
                                                  ,"false","true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x27d,(char *)CONCAT71(gtest_ar_41._1_7_,
                                                                          gtest_ar_41.success_));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&gtest_ar_37);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar_37._0_8_ != 0) {
                                                    (**(code **)(*(long *)gtest_ar_37._0_8_ + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar,"repeated_string",
                                                             (allocator<char> *)&local_48);
                                                  pFVar3 = F(this,(string *)&gtest_ar);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)&gtest_ar_41,this_00,message,
                                                             pFVar3,0);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar_37,"\"215\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_string\"), 0)"
                                                  ,(char (*) [4])"215",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar_41);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  std::__cxx11::string::~string((string *)&gtest_ar)
                                                  ;
                                                  if (gtest_ar_37.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_37.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_37.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x27f,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_37.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar,"repeated_bytes",
                                                             (allocator<char> *)&local_48);
                                                  pFVar3 = F(this,(string *)&gtest_ar);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)&gtest_ar_41,this_00,message,
                                                             pFVar3,0);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar_37,"\"216\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_bytes\"), 0)"
                                                  ,(char (*) [4])"216",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar_41);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  std::__cxx11::string::~string((string *)&gtest_ar)
                                                  ;
                                                  if (gtest_ar_37.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_37.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_37.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x281,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_37.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_string",
                                                             (allocator<char> *)&gtest_ar_37);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,0,
                                                                      &scratch);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar,"\"215\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_string\"), 0, &scratch)"
                                                  ,(char (*) [4])"215",psVar4);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x284,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,"repeated_bytes"
                                                             ,(allocator<char> *)&gtest_ar_37);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,0,
                                                                      &scratch);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar,"\"216\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_bytes\"), 0, &scratch)"
                                                  ,(char (*) [4])"216",psVar4);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x286,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,"repeatedgroup",
                                                             (allocator<char> *)&gtest_ar);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  gtest_ar.success_ = true;
                                                  gtest_ar._1_3_ = 0;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->repeated_group_a_);
                                                  gtest_ar_37._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar_41,"217",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, repeated_group_a_)"
                                                  ,(int *)&gtest_ar,(int *)&gtest_ar_37);
                                                  if (gtest_ar_41.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_41.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_41.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x28a,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_
                                                                      ) != (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar._4_4_,
                                                                                   gtest_ar._0_4_) +
                                                                8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_41.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_nested_message",
                                                             (allocator<char> *)&gtest_ar);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  gtest_ar.success_ = true;
                                                  gtest_ar._1_3_ = 0;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->nested_b_);
                                                  gtest_ar_37._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar_41,"218",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, nested_b_)"
                                                  ,(int *)&gtest_ar,(int *)&gtest_ar_37);
                                                  if (gtest_ar_41.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_41.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_41.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x28e,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_
                                                                      ) != (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar._4_4_,
                                                                                   gtest_ar._0_4_) +
                                                                8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_41.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_foreign_message",
                                                             (allocator<char> *)&gtest_ar);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  gtest_ar.success_ = true;
                                                  gtest_ar._1_3_ = 0;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->foreign_c_);
                                                  gtest_ar_37._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar_41,"219",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, foreign_c_)"
                                                  ,(int *)&gtest_ar,(int *)&gtest_ar_37);
                                                  if (gtest_ar_41.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_41.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_41.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x292,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_
                                                                      ) != (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar._4_4_,
                                                                                   gtest_ar._0_4_) +
                                                                8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_41.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_import_message",
                                                             (allocator<char> *)&gtest_ar);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  gtest_ar.success_ = true;
                                                  gtest_ar._1_3_ = 0;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->import_d_);
                                                  gtest_ar_37._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar_41,"220",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, import_d_)"
                                                  ,(int *)&gtest_ar,(int *)&gtest_ar_37);
                                                  if (gtest_ar_41.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_41.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_41.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x296,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_
                                                                      ) != (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar._4_4_,
                                                                                   gtest_ar._0_4_) +
                                                                8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_41.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_lazy_message",
                                                             (allocator<char> *)&gtest_ar);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  gtest_ar.success_ = true;
                                                  gtest_ar._1_3_ = 0;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->nested_b_);
                                                  gtest_ar_37._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar_41,"227",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, nested_b_)"
                                                  ,(int *)&gtest_ar,(int *)&gtest_ar_37);
                                                  if (gtest_ar_41.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_41.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_41.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x29a,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_
                                                                      ) != (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar._4_4_,
                                                                                   gtest_ar._0_4_) +
                                                                8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_41.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_nested_enum",
                                                             (allocator<char> *)&local_48);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedEnum
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::
                                                  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
                                                            ((internal *)&gtest_ar,"nested_bar_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum(message, F(\"repeated_nested_enum\"), 0)"
                                                  ,&this->nested_bar_,
                                                  (EnumValueDescriptor **)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x29d,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_foreign_enum",
                                                             (allocator<char> *)&local_48);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedEnum
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::
                                                  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
                                                            ((internal *)&gtest_ar,"foreign_bar_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum( message, F(\"repeated_foreign_enum\"), 0)"
                                                  ,&this->foreign_bar_,
                                                  (EnumValueDescriptor **)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x29f,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_import_enum",
                                                             (allocator<char> *)&local_48);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedEnum
                                                                 (this_00,message,pFVar3,0);
                                                  testing::internal::
                                                  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
                                                            ((internal *)&gtest_ar,"import_bar_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum(message, F(\"repeated_import_enum\"), 0)"
                                                  ,&this->import_bar_,
                                                  (EnumValueDescriptor **)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2a1,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar,
                                                             "repeated_string_piece",
                                                             (allocator<char> *)&local_48);
                                                  pFVar3 = F(this,(string *)&gtest_ar);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)&gtest_ar_41,this_00,message,
                                                             pFVar3,0);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar_37,"\"224\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString( message, F(\"repeated_string_piece\"), 0)"
                                                  ,(char (*) [4])"224",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar_41);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  std::__cxx11::string::~string((string *)&gtest_ar)
                                                  ;
                                                  if (gtest_ar_37.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_37.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_37.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2a4,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_37.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_string_piece",
                                                             (allocator<char> *)&gtest_ar_37);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,0,
                                                                      &scratch);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar,"\"224\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_string_piece\"), 0, &scratch)"
                                                  ,(char (*) [4])"224",psVar4);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2a6,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar,"repeated_cord",
                                                             (allocator<char> *)&local_48);
                                                  pFVar3 = F(this,(string *)&gtest_ar);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)&gtest_ar_41,this_00,message,
                                                             pFVar3,0);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar_37,"\"225\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_cord\"), 0)"
                                                  ,(char (*) [4])"225",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar_41);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  std::__cxx11::string::~string((string *)&gtest_ar)
                                                  ;
                                                  if (gtest_ar_37.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_37.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_37.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2a9,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_37.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,"repeated_cord",
                                                             (allocator<char> *)&gtest_ar_37);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,0,
                                                                      &scratch);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar,"\"225\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_cord\"), 0, &scratch)"
                                                  ,(char (*) [4])"225",psVar4);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2ab,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  gtest_ar_37._0_4_ = 0x12d;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,"repeated_int32"
                                                             ,&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  local_48.data_._0_4_ =
                                                       (float)Reflection::GetRepeatedInt32
                                                                        (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar,"301",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_int32\"), 1)"
                                                  ,(int *)&gtest_ar_37,(int *)&local_48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2ad,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  local_48.data_._0_4_ = 4.23192e-43;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,"repeated_int64"
                                                             ,&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedInt64
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)&gtest_ar,"302",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_int64\"), 1)"
                                                  ,(int *)&local_48,(long *)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2ae,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  gtest_ar_37._0_4_ = 0x12f;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_uint32",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  local_48.data_._0_4_ =
                                                       (float)Reflection::GetRepeatedUInt32
                                                                        (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)&gtest_ar,"303",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt32(message, F(\"repeated_uint32\"), 1)"
                                                  ,(int *)&gtest_ar_37,(uint *)&local_48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2b0,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  local_48.data_._0_4_ = 4.25995e-43;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_uint64",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedUInt64
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)&gtest_ar,"304",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt64(message, F(\"repeated_uint64\"), 1)"
                                                  ,(int *)&local_48,(unsigned_long *)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2b2,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  gtest_ar_37._0_4_ = 0x131;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_sint32",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  local_48.data_._0_4_ =
                                                       (float)Reflection::GetRepeatedInt32
                                                                        (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar,"305",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_sint32\"), 1)"
                                                  ,(int *)&gtest_ar_37,(int *)&local_48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2b4,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  local_48.data_._0_4_ = 4.28797e-43;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_sint64",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedInt64
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)&gtest_ar,"306",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_sint64\"), 1)"
                                                  ,(int *)&local_48,(long *)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2b6,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  gtest_ar_37._0_4_ = 0x133;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_fixed32",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  local_48.data_._0_4_ =
                                                       (float)Reflection::GetRepeatedUInt32
                                                                        (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,unsigned_int>
                                                            ((internal *)&gtest_ar,"307",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt32(message, F(\"repeated_fixed32\"), 1)"
                                                  ,(int *)&gtest_ar_37,(uint *)&local_48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2b8,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  local_48.data_._0_4_ = 4.316e-43;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_fixed64",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedUInt64
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,unsigned_long>
                                                            ((internal *)&gtest_ar,"308",
                                                                                                                          
                                                  "reflection->GetRepeatedUInt64(message, F(\"repeated_fixed64\"), 1)"
                                                  ,(int *)&local_48,(unsigned_long *)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2ba,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  gtest_ar_37._0_4_ = 0x135;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_sfixed32",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  local_48.data_._0_4_ =
                                                       (float)Reflection::GetRepeatedInt32
                                                                        (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar,"309",
                                                                                                                          
                                                  "reflection->GetRepeatedInt32(message, F(\"repeated_sfixed32\"), 1)"
                                                  ,(int *)&gtest_ar_37,(int *)&local_48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,700,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  local_48.data_._0_4_ = 4.34403e-43;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_sfixed64",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedInt64
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,long>
                                                            ((internal *)&gtest_ar,"310",
                                                                                                                          
                                                  "reflection->GetRepeatedInt64(message, F(\"repeated_sfixed64\"), 1)"
                                                  ,(int *)&local_48,(long *)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2be,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  gtest_ar_37._0_4_ = 0x137;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,"repeated_float"
                                                             ,&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  local_48.data_._0_4_ =
                                                       Reflection::GetRepeatedFloat
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,float>
                                                            ((internal *)&gtest_ar,"311",
                                                                                                                          
                                                  "reflection->GetRepeatedFloat(message, F(\"repeated_float\"), 1)"
                                                  ,(int *)&gtest_ar_37,(float *)&local_48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2bf,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  local_48.data_._0_4_ = 4.37205e-43;
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_double",&local_99);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedDouble
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::CmpHelperEQ<int,double>
                                                            ((internal *)&gtest_ar,"312",
                                                                                                                          
                                                  "reflection->GetRepeatedDouble(message, F(\"repeated_double\"), 1)"
                                                  ,(int *)&local_48,(double *)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2c1,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,"repeated_bool",
                                                             (allocator<char> *)&gtest_ar_37);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  bVar1 = Reflection::GetRepeatedBool
                                                                    (this_00,message,pFVar3,1);
                                                  gtest_ar.success_ = !bVar1;
                                                  gtest_ar.message_._M_t.
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl =
                                                       (
                                                  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                                  )(
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0;
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_37);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)&gtest_ar_41,
                                                               (internal *)&gtest_ar,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "reflection->GetRepeatedBool(message, F(\"repeated_bool\"), 1)"
                                                  ,"true","false",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            (&local_48,kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2c2,(char *)CONCAT71(gtest_ar_41._1_7_,
                                                                          gtest_ar_41.success_));
                                                  testing::internal::AssertHelper::operator=
                                                            (&local_48,(Message *)&gtest_ar_37);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            (&local_48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar_37._0_8_ != 0) {
                                                    (**(code **)(*(long *)gtest_ar_37._0_8_ + 8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar,"repeated_string",
                                                             (allocator<char> *)&local_48);
                                                  pFVar3 = F(this,(string *)&gtest_ar);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)&gtest_ar_41,this_00,message,
                                                             pFVar3,1);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar_37,"\"315\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_string\"), 1)"
                                                  ,(char (*) [4])"315",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar_41);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  std::__cxx11::string::~string((string *)&gtest_ar)
                                                  ;
                                                  if (gtest_ar_37.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_37.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_37.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2c4,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_37.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar,"repeated_bytes",
                                                             (allocator<char> *)&local_48);
                                                  pFVar3 = F(this,(string *)&gtest_ar);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)&gtest_ar_41,this_00,message,
                                                             pFVar3,1);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar_37,"\"316\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_bytes\"), 1)"
                                                  ,(char (*) [4])"316",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar_41);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  std::__cxx11::string::~string((string *)&gtest_ar)
                                                  ;
                                                  if (gtest_ar_37.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_37.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_37.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2c6,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_37.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_string",
                                                             (allocator<char> *)&gtest_ar_37);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,1,
                                                                      &scratch);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar,"\"315\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_string\"), 1, &scratch)"
                                                  ,(char (*) [4])"315",psVar4);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2c9,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,"repeated_bytes"
                                                             ,(allocator<char> *)&gtest_ar_37);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,1,
                                                                      &scratch);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar,"\"316\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_bytes\"), 1, &scratch)"
                                                  ,(char (*) [4])"316",psVar4);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2cb,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,"repeatedgroup",
                                                             (allocator<char> *)&gtest_ar);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,1);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  gtest_ar.success_ = true;
                                                  gtest_ar._1_3_ = 1;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->repeated_group_a_);
                                                  gtest_ar_37._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar_41,"317",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, repeated_group_a_)"
                                                  ,(int *)&gtest_ar,(int *)&gtest_ar_37);
                                                  if (gtest_ar_41.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_41.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_41.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2cf,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_
                                                                      ) != (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar._4_4_,
                                                                                   gtest_ar._0_4_) +
                                                                8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_41.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_nested_message",
                                                             (allocator<char> *)&gtest_ar);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,1);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  gtest_ar.success_ = true;
                                                  gtest_ar._1_3_ = 1;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->nested_b_);
                                                  gtest_ar_37._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar_41,"318",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, nested_b_)"
                                                  ,(int *)&gtest_ar,(int *)&gtest_ar_37);
                                                  if (gtest_ar_41.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_41.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_41.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2d3,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_
                                                                      ) != (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar._4_4_,
                                                                                   gtest_ar._0_4_) +
                                                                8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_41.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_foreign_message",
                                                             (allocator<char> *)&gtest_ar);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,1);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  gtest_ar.success_ = true;
                                                  gtest_ar._1_3_ = 1;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->foreign_c_);
                                                  gtest_ar_37._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar_41,"319",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, foreign_c_)"
                                                  ,(int *)&gtest_ar,(int *)&gtest_ar_37);
                                                  if (gtest_ar_41.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_41.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_41.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2d7,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_
                                                                      ) != (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar._4_4_,
                                                                                   gtest_ar._0_4_) +
                                                                8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_41.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_import_message",
                                                             (allocator<char> *)&gtest_ar);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,1);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  gtest_ar.success_ = true;
                                                  gtest_ar._1_3_ = 1;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->import_d_);
                                                  gtest_ar_37._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar_41,"320",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, import_d_)"
                                                  ,(int *)&gtest_ar,(int *)&gtest_ar_37);
                                                  if (gtest_ar_41.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_41.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_41.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2db,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_
                                                                      ) != (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar._4_4_,
                                                                                   gtest_ar._0_4_) +
                                                                8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_41.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_lazy_message",
                                                             (allocator<char> *)&gtest_ar);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  pMVar5 = Reflection::GetRepeatedMessage
                                                                     (this_00,message,pFVar3,1);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  gtest_ar.success_ = true;
                                                  gtest_ar._1_3_ = 1;
                                                  MVar7 = Message::GetMetadata(pMVar5);
                                                  iVar2 = Reflection::GetInt32
                                                                    (MVar7.reflection,pMVar5,
                                                                     this->nested_b_);
                                                  gtest_ar_37._0_4_ = iVar2;
                                                  testing::internal::CmpHelperEQ<int,int>
                                                            ((internal *)&gtest_ar_41,"327",
                                                                                                                          
                                                  "sub_message->GetReflection()->GetInt32(*sub_message, nested_b_)"
                                                  ,(int *)&gtest_ar,(int *)&gtest_ar_37);
                                                  if (gtest_ar_41.success_ == false) {
                                                    testing::Message::Message((Message *)&gtest_ar);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_41.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_41.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2df,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_
                                                                      ) != (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT44(gtest_ar._4_4_,
                                                                                   gtest_ar._0_4_) +
                                                                8))();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_41.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_nested_enum",
                                                             (allocator<char> *)&local_48);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedEnum
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::
                                                  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
                                                            ((internal *)&gtest_ar,"nested_baz_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum(message, F(\"repeated_nested_enum\"), 1)"
                                                  ,&this->nested_baz_,
                                                  (EnumValueDescriptor **)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2e2,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_foreign_enum",
                                                             (allocator<char> *)&local_48);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedEnum
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::
                                                  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
                                                            ((internal *)&gtest_ar,"foreign_baz_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum( message, F(\"repeated_foreign_enum\"), 1)"
                                                  ,&this->foreign_baz_,
                                                  (EnumValueDescriptor **)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2e4,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_import_enum",
                                                             (allocator<char> *)&local_48);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  gtest_ar_37._0_8_ =
                                                       Reflection::GetRepeatedEnum
                                                                 (this_00,message,pFVar3,1);
                                                  testing::internal::
                                                  CmpHelperEQ<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*>
                                                            ((internal *)&gtest_ar,"import_baz_",
                                                                                                                          
                                                  "reflection->GetRepeatedEnum(message, F(\"repeated_import_enum\"), 1)"
                                                  ,&this->import_baz_,
                                                  (EnumValueDescriptor **)&gtest_ar_37);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2e6,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar,
                                                             "repeated_string_piece",
                                                             (allocator<char> *)&local_48);
                                                  pFVar3 = F(this,(string *)&gtest_ar);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)&gtest_ar_41,this_00,message,
                                                             pFVar3,1);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar_37,"\"324\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString( message, F(\"repeated_string_piece\"), 1)"
                                                  ,(char (*) [4])"324",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar_41);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  std::__cxx11::string::~string((string *)&gtest_ar)
                                                  ;
                                                  if (gtest_ar_37.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_37.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_37.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2e9,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_37.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,
                                                             "repeated_string_piece",
                                                             (allocator<char> *)&gtest_ar_37);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,1,
                                                                      &scratch);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar,"\"324\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_string_piece\"), 1, &scratch)"
                                                  ,(char (*) [4])"324",psVar4);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2eb,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar,"repeated_cord",
                                                             (allocator<char> *)&local_48);
                                                  pFVar3 = F(this,(string *)&gtest_ar);
                                                  Reflection::GetRepeatedString_abi_cxx11_
                                                            ((string *)&gtest_ar_41,this_00,message,
                                                             pFVar3,1);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar_37,"\"325\"",
                                                                                                                          
                                                  "reflection->GetRepeatedString(message, F(\"repeated_cord\"), 1)"
                                                  ,(char (*) [4])"325",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&gtest_ar_41);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  std::__cxx11::string::~string((string *)&gtest_ar)
                                                  ;
                                                  if (gtest_ar_37.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar_37.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar_37.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2ee,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  std::
                                                  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::~unique_ptr(&gtest_ar_37.message_);
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&gtest_ar_41,"repeated_cord",
                                                             (allocator<char> *)&gtest_ar_37);
                                                  pFVar3 = F(this,(string *)&gtest_ar_41);
                                                  psVar4 = Reflection::GetRepeatedStringReference
                                                                     (this_00,message,pFVar3,1,
                                                                      &scratch);
                                                  testing::internal::
                                                  CmpHelperEQ<char[4],std::__cxx11::string>
                                                            ((internal *)&gtest_ar,"\"325\"",
                                                                                                                          
                                                  "reflection->GetRepeatedStringReference( message, F(\"repeated_cord\"), 1, &scratch)"
                                                  ,(char (*) [4])"325",psVar4);
                                                  std::__cxx11::string::~string
                                                            ((string *)&gtest_ar_41);
                                                  if (gtest_ar.success_ == false) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_41);
                                                    if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kNonFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x2f0,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37);
                                                  if ((long *)CONCAT71(gtest_ar_41._1_7_,
                                                                       gtest_ar_41.success_) !=
                                                      (long *)0x0) {
                                                    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_
                                                                                   ,gtest_ar_41.
                                                                                    success_) + 8))
                                                              ();
                                                  }
                                                  }
                                                  goto LAB_005126c2;
                                                  }
                                                  testing::Message::Message((Message *)&gtest_ar_41)
                                                  ;
                                                  if ((
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )gtest_ar.message_._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl ==
                                                  (
                                                  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )0x0) {
                                                    pcVar6 = anon_var_dwarf_651463 + 5;
                                                  }
                                                  else {
                                                    pcVar6 = *(char **)gtest_ar.message_._M_t.
                                                                                                                                              
                                                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                                  ._M_head_impl;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/test_util.h"
                                                  ,0x266,pcVar6);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_37,
                                                             (Message *)&gtest_ar_41);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_37);
  if ((long *)CONCAT71(gtest_ar_41._1_7_,gtest_ar_41.success_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_ar_41._1_7_,gtest_ar_41.success_) + 8))();
  }
LAB_005126c2:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&scratch);
  return;
}

Assistant:

inline void TestUtil::ReflectionTester::ExpectAllFieldsSetViaReflection2(
    const Message& message) {
  const Reflection* reflection = message.GetReflection();
  std::string scratch;
  const Message* sub_message;

  // -----------------------------------------------------------------

  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_int32")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_int64")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_uint32")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_uint64")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_sint32")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_sint64")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_fixed32")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_fixed64")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_sfixed32")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_sfixed64")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_float")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_double")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_bool")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_string")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_bytes")));

  ASSERT_EQ(2, reflection->FieldSize(message, F("repeatedgroup")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_nested_message")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_foreign_message")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_import_message")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_lazy_message")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_nested_enum")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_foreign_enum")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_import_enum")));

  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_string_piece")));
  ASSERT_EQ(2, reflection->FieldSize(message, F("repeated_cord")));

  EXPECT_EQ(201, reflection->GetRepeatedInt32(message, F("repeated_int32"), 0));
  EXPECT_EQ(202, reflection->GetRepeatedInt64(message, F("repeated_int64"), 0));
  EXPECT_EQ(203,
            reflection->GetRepeatedUInt32(message, F("repeated_uint32"), 0));
  EXPECT_EQ(204,
            reflection->GetRepeatedUInt64(message, F("repeated_uint64"), 0));
  EXPECT_EQ(205,
            reflection->GetRepeatedInt32(message, F("repeated_sint32"), 0));
  EXPECT_EQ(206,
            reflection->GetRepeatedInt64(message, F("repeated_sint64"), 0));
  EXPECT_EQ(207,
            reflection->GetRepeatedUInt32(message, F("repeated_fixed32"), 0));
  EXPECT_EQ(208,
            reflection->GetRepeatedUInt64(message, F("repeated_fixed64"), 0));
  EXPECT_EQ(209,
            reflection->GetRepeatedInt32(message, F("repeated_sfixed32"), 0));
  EXPECT_EQ(210,
            reflection->GetRepeatedInt64(message, F("repeated_sfixed64"), 0));
  EXPECT_EQ(211, reflection->GetRepeatedFloat(message, F("repeated_float"), 0));
  EXPECT_EQ(212,
            reflection->GetRepeatedDouble(message, F("repeated_double"), 0));
  EXPECT_TRUE(reflection->GetRepeatedBool(message, F("repeated_bool"), 0));
  EXPECT_EQ("215",
            reflection->GetRepeatedString(message, F("repeated_string"), 0));
  EXPECT_EQ("216",
            reflection->GetRepeatedString(message, F("repeated_bytes"), 0));

  EXPECT_EQ("215", reflection->GetRepeatedStringReference(
                       message, F("repeated_string"), 0, &scratch));
  EXPECT_EQ("216", reflection->GetRepeatedStringReference(
                       message, F("repeated_bytes"), 0, &scratch));

  sub_message = &reflection->GetRepeatedMessage(message, F("repeatedgroup"), 0);
  EXPECT_EQ(217, sub_message->GetReflection()->GetInt32(*sub_message,
                                                        repeated_group_a_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_nested_message"), 0);
  EXPECT_EQ(218,
            sub_message->GetReflection()->GetInt32(*sub_message, nested_b_));
  sub_message = &reflection->GetRepeatedMessage(
      message, F("repeated_foreign_message"), 0);
  EXPECT_EQ(219,
            sub_message->GetReflection()->GetInt32(*sub_message, foreign_c_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_import_message"), 0);
  EXPECT_EQ(220,
            sub_message->GetReflection()->GetInt32(*sub_message, import_d_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_lazy_message"), 0);
  EXPECT_EQ(227,
            sub_message->GetReflection()->GetInt32(*sub_message, nested_b_));

  EXPECT_EQ(nested_bar_,
            reflection->GetRepeatedEnum(message, F("repeated_nested_enum"), 0));
  EXPECT_EQ(foreign_bar_, reflection->GetRepeatedEnum(
                              message, F("repeated_foreign_enum"), 0));
  EXPECT_EQ(import_bar_,
            reflection->GetRepeatedEnum(message, F("repeated_import_enum"), 0));

  EXPECT_EQ("224", reflection->GetRepeatedString(
                       message, F("repeated_string_piece"), 0));
  EXPECT_EQ("224", reflection->GetRepeatedStringReference(
                       message, F("repeated_string_piece"), 0, &scratch));

  EXPECT_EQ("225",
            reflection->GetRepeatedString(message, F("repeated_cord"), 0));
  EXPECT_EQ("225", reflection->GetRepeatedStringReference(
                       message, F("repeated_cord"), 0, &scratch));

  EXPECT_EQ(301, reflection->GetRepeatedInt32(message, F("repeated_int32"), 1));
  EXPECT_EQ(302, reflection->GetRepeatedInt64(message, F("repeated_int64"), 1));
  EXPECT_EQ(303,
            reflection->GetRepeatedUInt32(message, F("repeated_uint32"), 1));
  EXPECT_EQ(304,
            reflection->GetRepeatedUInt64(message, F("repeated_uint64"), 1));
  EXPECT_EQ(305,
            reflection->GetRepeatedInt32(message, F("repeated_sint32"), 1));
  EXPECT_EQ(306,
            reflection->GetRepeatedInt64(message, F("repeated_sint64"), 1));
  EXPECT_EQ(307,
            reflection->GetRepeatedUInt32(message, F("repeated_fixed32"), 1));
  EXPECT_EQ(308,
            reflection->GetRepeatedUInt64(message, F("repeated_fixed64"), 1));
  EXPECT_EQ(309,
            reflection->GetRepeatedInt32(message, F("repeated_sfixed32"), 1));
  EXPECT_EQ(310,
            reflection->GetRepeatedInt64(message, F("repeated_sfixed64"), 1));
  EXPECT_EQ(311, reflection->GetRepeatedFloat(message, F("repeated_float"), 1));
  EXPECT_EQ(312,
            reflection->GetRepeatedDouble(message, F("repeated_double"), 1));
  EXPECT_FALSE(reflection->GetRepeatedBool(message, F("repeated_bool"), 1));
  EXPECT_EQ("315",
            reflection->GetRepeatedString(message, F("repeated_string"), 1));
  EXPECT_EQ("316",
            reflection->GetRepeatedString(message, F("repeated_bytes"), 1));

  EXPECT_EQ("315", reflection->GetRepeatedStringReference(
                       message, F("repeated_string"), 1, &scratch));
  EXPECT_EQ("316", reflection->GetRepeatedStringReference(
                       message, F("repeated_bytes"), 1, &scratch));

  sub_message = &reflection->GetRepeatedMessage(message, F("repeatedgroup"), 1);
  EXPECT_EQ(317, sub_message->GetReflection()->GetInt32(*sub_message,
                                                        repeated_group_a_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_nested_message"), 1);
  EXPECT_EQ(318,
            sub_message->GetReflection()->GetInt32(*sub_message, nested_b_));
  sub_message = &reflection->GetRepeatedMessage(
      message, F("repeated_foreign_message"), 1);
  EXPECT_EQ(319,
            sub_message->GetReflection()->GetInt32(*sub_message, foreign_c_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_import_message"), 1);
  EXPECT_EQ(320,
            sub_message->GetReflection()->GetInt32(*sub_message, import_d_));
  sub_message =
      &reflection->GetRepeatedMessage(message, F("repeated_lazy_message"), 1);
  EXPECT_EQ(327,
            sub_message->GetReflection()->GetInt32(*sub_message, nested_b_));

  EXPECT_EQ(nested_baz_,
            reflection->GetRepeatedEnum(message, F("repeated_nested_enum"), 1));
  EXPECT_EQ(foreign_baz_, reflection->GetRepeatedEnum(
                              message, F("repeated_foreign_enum"), 1));
  EXPECT_EQ(import_baz_,
            reflection->GetRepeatedEnum(message, F("repeated_import_enum"), 1));

  EXPECT_EQ("324", reflection->GetRepeatedString(
                       message, F("repeated_string_piece"), 1));
  EXPECT_EQ("324", reflection->GetRepeatedStringReference(
                       message, F("repeated_string_piece"), 1, &scratch));

  EXPECT_EQ("325",
            reflection->GetRepeatedString(message, F("repeated_cord"), 1));
  EXPECT_EQ("325", reflection->GetRepeatedStringReference(
                       message, F("repeated_cord"), 1, &scratch));
}